

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O1

void __thiscall IGameController::CheckTeamBalance(IGameController *this)

{
  IConsole *pIVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  char aBuf [256];
  char acStack_118 [264];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_GameFlags & 1) == 0) || (this->m_pConfig->m_SvTeambalanceTime == 0)) {
    this->m_UnbalancedTick = -1;
    goto LAB_001204cd;
  }
  uVar2 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  if (uVar4 < 2) {
    str_format(acStack_118,0x100,"Teams are balanced (red=%d blue=%d)");
    iVar3 = -1;
LAB_001204a7:
    this->m_UnbalancedTick = iVar3;
  }
  else {
    str_format(acStack_118,0x100,"Teams are NOT balanced (red=%d blue=%d)");
    if (this->m_UnbalancedTick < 0) {
      iVar3 = this->m_pServer->m_CurrentGameTick;
      goto LAB_001204a7;
    }
  }
  pIVar1 = this->m_pGameServer->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,2,"game",acStack_118,0);
LAB_001204cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::CheckTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime)
	{
		m_UnbalancedTick = TBALANCE_OK;
		return;
	}

	// check if teams are unbalanced
	char aBuf[256];
	if(absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) >= NUM_TEAMS)
	{
		str_format(aBuf, sizeof(aBuf), "Teams are NOT balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		if(m_UnbalancedTick <= TBALANCE_OK)
			m_UnbalancedTick = Server()->Tick();
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "Teams are balanced (red=%d blue=%d)", m_aTeamSize[TEAM_RED], m_aTeamSize[TEAM_BLUE]);
		m_UnbalancedTick = TBALANCE_OK;
	}
	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
}